

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

parse_dynamic_spec_result<char>
fmt::v11::detail::parse_dynamic_spec<char>
          (char *begin,char *end,int *value,arg_ref<char> *ref,parse_context<char> *ctx)

{
  char cVar1;
  int iVar2;
  undefined8 *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  parse_context<char> *in_R8;
  parse_dynamic_spec_result<char> pVar3;
  int id;
  char c;
  int val;
  arg_id_kind kind;
  parse_context<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  undefined4 local_58;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined3 in_stack_ffffffffffffffc4;
  uint uVar4;
  char *local_18;
  char *local_10;
  undefined4 local_8;
  
  uVar4 = CONCAT13(in_RDI != in_RSI,in_stack_ffffffffffffffc4);
  ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffc7,(char (*) [1])0x2d0f2f);
  local_8 = 0;
  if (('/' < *in_RDI) && (*in_RDI < ':')) {
    iVar2 = parse_nonnegative_int<char>
                      ((char **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
    if (iVar2 == -1) {
      report_error(in_stack_ffffffffffffffa0);
    }
    *in_RDX = iVar2;
    local_10 = in_RDI;
LAB_0026bc36:
    pVar3.kind = local_8;
    pVar3.end = local_10;
    pVar3._12_4_ = 0;
    return pVar3;
  }
  if (*in_RDI == '{') {
    local_18 = in_RDI + 1;
    if (local_18 != in_RSI) {
      cVar1 = *local_18;
      if ((cVar1 == '}') || (cVar1 == ':')) {
        iVar2 = parse_context<char>::next_arg_id(in_stack_ffffffffffffff90);
        arg_ref<char>::arg_ref((arg_ref<char> *)&stack0xffffffffffffffa0,iVar2);
        *in_RCX = in_stack_ffffffffffffffa0;
        in_RCX[1] = CONCAT44(in_stack_ffffffffffffffac,local_58);
        local_8 = 1;
        parse_context<char>::check_dynamic_spec(in_R8,iVar2);
      }
      else {
        local_18 = parse_arg_id<char,fmt::v11::detail::dynamic_spec_handler<char>>
                             ((char *)in_R8,(char *)((ulong)uVar4 << 0x20),
                              (dynamic_spec_handler<char> *)
                              CONCAT44(in_stack_ffffffffffffffbc,
                                       CONCAT13(cVar1,(int3)in_stack_ffffffffffffffb8)));
      }
    }
    if ((local_18 != in_RSI) && (*local_18 == '}')) {
      local_10 = local_18 + 1;
      goto LAB_0026bc36;
    }
  }
  report_error(in_stack_ffffffffffffffa0);
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      parse_context<Char>& ctx)
    -> parse_dynamic_spec_result<Char> {
  FMT_ASSERT(begin != end, "");
  auto kind = arg_id_kind::none;
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val == -1) report_error("number is too big");
    value = val;
  } else {
    if (*begin == '{') {
      ++begin;
      if (begin != end) {
        Char c = *begin;
        if (c == '}' || c == ':') {
          int id = ctx.next_arg_id();
          ref = id;
          kind = arg_id_kind::index;
          ctx.check_dynamic_spec(id);
        } else {
          begin = parse_arg_id(begin, end,
                               dynamic_spec_handler<Char>{ctx, ref, kind});
        }
      }
      if (begin != end && *begin == '}') return {++begin, kind};
    }
    report_error("invalid format string");
  }
  return {begin, kind};
}